

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_mem clCreateFromGLRenderbuffer
                 (cl_context context,cl_mem_flags flags,cl_GLuint renderbuffer,cl_int *errcode_ret)

{
  CTracker *pCVar1;
  CLIntercept *this;
  byte bVar2;
  time_point start;
  cl_mem image;
  time_point end;
  allocator local_5d;
  cl_int localErrorCode;
  uint64_t local_58;
  string local_50;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     ((g_pIntercept->m_Dispatch).clCreateFromGLRenderbuffer ==
      (cl_api_clCreateFromGLRenderbuffer)0x0)) {
    if (errcode_ret != (cl_int *)0x0) {
      *errcode_ret = -0x22;
    }
    return (cl_mem)0x0;
  }
  local_58 = (g_pIntercept->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  bVar2 = (g_pIntercept->m_Config).CallLogging;
  if ((bool)bVar2 == true) {
    CEnumNameMap::name_mem_flags_abi_cxx11_(&local_50,&g_pIntercept->m_EnumNameMap,flags);
    CLIntercept::callLoggingEnter
              (this,"clCreateFromGLRenderbuffer",local_58,(cl_kernel)0x0,
               "context = %p, flags = %s (%llX)",context,local_50._M_dataplus._M_p,flags);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = (this->m_Config).CallLogging;
  }
  localErrorCode = 0;
  if ((((bVar2 & 1) == 0) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_00126938:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_00126938;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    start.__d.__r = (duration)0;
  }
  else {
    start.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  image = (*(this->m_Dispatch).clCreateFromGLRenderbuffer)(context,flags,renderbuffer,errcode_ret);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_58 &&
        (local_58 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_50,"",&local_5d);
      CLIntercept::updateHostTimingStats(this,"clCreateFromGLRenderbuffer",&local_50,start,end);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((image != (cl_mem)0x0) &&
     ((((this->m_Config).DumpImagesBeforeEnqueue != false ||
       ((this->m_Config).DumpImagesAfterEnqueue != false)) ||
      ((this->m_Config).CaptureReplay == true)))) {
    CLIntercept::addImage(this,image);
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar2 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_00126a85;
  }
  else {
    if (*errcode_ret == 0) goto LAB_00126a85;
    CLIntercept::logError(this,"clCreateFromGLRenderbuffer",*errcode_ret);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_00126a85:
  if ((image != (cl_mem)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_MemObjects;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clCreateFromGLRenderbuffer",*errcode_ret,(cl_event *)0x0,
               (cl_sync_point_khr *)0x0,"returned %p",image);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_50,"",&local_5d);
    CLIntercept::chromeCallLoggingExit
              (this,"clCreateFromGLRenderbuffer",&local_50,false,0,start,end);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return image;
}

Assistant:

CL_API_ENTRY cl_mem CL_API_CALL CLIRN(clCreateFromGLRenderbuffer)(
    cl_context context,
    cl_mem_flags flags,
    cl_GLuint renderbuffer,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clCreateFromGLRenderbuffer )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER(
            "context = %p, "
            "flags = %s (%llX)",
            context,
            pIntercept->enumName().name_mem_flags( flags ).c_str(),
            flags );
        CHECK_ERROR_INIT( errcode_ret );
        HOST_PERFORMANCE_TIMING_START();

        cl_mem  retVal = pIntercept->dispatch().clCreateFromGLRenderbuffer(
            context,
            flags,
            renderbuffer,
            errcode_ret);

        HOST_PERFORMANCE_TIMING_END();
        ADD_IMAGE( retVal );
        CHECK_ERROR( errcode_ret[0] );
        ADD_OBJECT_ALLOCATION( retVal );
        CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}